

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

AtanLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_atan(NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  AtanLayerParams *pAVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_atan(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_atan(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pAVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::AtanLayerParams>(arena);
    (this->layer_).atan_ = pAVar2;
  }
  return (AtanLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::AtanLayerParams* NeuralNetworkLayer::_internal_mutable_atan() {
  if (!_internal_has_atan()) {
    clear_layer();
    set_has_atan();
    layer_.atan_ = CreateMaybeMessage< ::CoreML::Specification::AtanLayerParams >(GetArenaForAllocation());
  }
  return layer_.atan_;
}